

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O1

void __thiscall
duckdb::UpdateSegment::FetchCommitted(UpdateSegment *this,idx_t vector_index,Vector *result)

{
  fetch_committed_function_t p_Var1;
  StorageLockKey *pSVar2;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> lock_handle;
  UndoBufferPointer node;
  UndoBufferReference pin;
  undefined1 local_60 [8];
  UndoBufferPointer local_58;
  UndoBufferReference local_48;
  
  pSVar2 = (StorageLockKey *)&this->lock;
  StorageLock::GetSharedLock((StorageLock *)local_60);
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>::operator*
            ((unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true>
              *)local_60);
  local_58 = GetUpdateNode(this,pSVar2,vector_index);
  if (local_58.entry != (UndoBufferEntry *)0x0) {
    UndoBufferPointer::Pin(&local_48,&local_58);
    p_Var1 = this->fetch_committed_function;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_48.handle.node);
    (*p_Var1)((UpdateInfo *)((local_48.handle.node.ptr)->buffer + local_48.position),result);
    BufferHandle::~BufferHandle(&local_48.handle);
  }
  if (local_60 != (undefined1  [8])0x0) {
    StorageLockKey::~StorageLockKey((StorageLockKey *)local_60);
    operator_delete((void *)local_60);
  }
  return;
}

Assistant:

void UpdateSegment::FetchCommitted(idx_t vector_index, Vector &result) {
	auto lock_handle = lock.GetSharedLock();
	auto node = GetUpdateNode(*lock_handle, vector_index);
	if (!node.IsSet()) {
		return;
	}
	// FIXME: normalify if this is not the case... need to pass in count?
	D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
	auto pin = node.Pin();
	fetch_committed_function(UpdateInfo::Get(pin), result);
}